

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lj_debug_slotname(GCproto *pt,BCIns *ip,BCReg slot,char **name)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  long *in_RCX;
  uint in_EDX;
  GCproto *in_RSI;
  GCproto *in_RDI;
  BCIns insp;
  BCReg ra;
  BCOp op;
  BCIns ins;
  char *lname;
  BCReg in_stack_ffffffffffffffe0;
  GCproto *pGVar5;
  char *local_8;
  
LAB_00115cd7:
  pcVar4 = debug_varname(in_RSI,in_EDX,in_stack_ffffffffffffffe0);
  if (pcVar4 != (char *)0x0) {
    *in_RCX = (long)pcVar4;
    local_8 = "local";
    return local_8;
  }
LAB_00115d29:
  do {
    while( true ) {
      pGVar5 = in_RSI;
      in_RSI = (GCproto *)&pGVar5[-1].varinfo;
      if (in_RSI <= in_RDI + 1) {
        return (char *)0x0;
      }
      uVar1 = ((MRef *)in_RSI)->ptr32;
      uVar2 = uVar1 & 0xff;
      uVar3 = uVar1 >> 8 & 0xff;
      if ((lj_bc_mode[uVar2] & 7) != 2) break;
      if ((uVar3 <= in_EDX) && ((uVar2 != 0x2c || (in_EDX <= uVar1 >> 0x10)))) {
        return (char *)0x0;
      }
    }
  } while (((lj_bc_mode[uVar2] & 7) != 1) || (uVar3 != in_EDX));
  switch(uVar1 & 0xff) {
  case 0x12:
    break;
  default:
    return (char *)0x0;
  case 0x2d:
    pcVar4 = lj_debug_uvname(in_RDI,uVar1 >> 0x10);
    *in_RCX = (long)pcVar4;
    local_8 = "upvalue";
    return local_8;
  case 0x36:
    *in_RCX = (ulong)*(uint *)((ulong)(in_RDI->k).ptr32 +
                              ((ulong)(uVar1 >> 0x10) ^ 0xffffffffffffffff) * 4) + 0x10;
    local_8 = "global";
    return local_8;
  case 0x39:
    *in_RCX = (ulong)*(uint *)((ulong)(in_RDI->k).ptr32 +
                              ((ulong)(uVar1 >> 0x10 & 0xff) ^ 0xffffffffffffffff) * 4) + 0x10;
    if ((((in_RDI + 1 < in_RSI) && (uVar2 = pGVar5[-1].uvinfo.ptr32, (uVar2 & 0xff) == 0x12)) &&
        ((uVar2 >> 8 & 0xff) == uVar3 + 1)) && (uVar2 >> 0x10 == uVar1 >> 0x18)) {
      local_8 = "method";
      return local_8;
    }
    local_8 = "field";
    return local_8;
  }
  if (uVar3 == in_EDX) goto code_r0x00115e1d;
  goto LAB_00115d29;
code_r0x00115e1d:
  in_EDX = uVar1 >> 0x10;
  goto LAB_00115cd7;
}

Assistant:

const char *lj_debug_slotname(GCproto *pt, const BCIns *ip, BCReg slot,
			      const char **name)
{
  const char *lname;
restart:
  lname = debug_varname(pt, proto_bcpos(pt, ip), slot);
  if (lname != NULL) { *name = lname; return "local"; }
  while (--ip > proto_bc(pt)) {
    BCIns ins = *ip;
    BCOp op = bc_op(ins);
    BCReg ra = bc_a(ins);
    if (bcmode_a(op) == BCMbase) {
      if (slot >= ra && (op != BC_KNIL || slot <= bc_d(ins)))
	return NULL;
    } else if (bcmode_a(op) == BCMdst && ra == slot) {
      switch (bc_op(ins)) {
      case BC_MOV:
	if (ra == slot) { slot = bc_d(ins); goto restart; }
	break;
      case BC_GGET:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_d(ins))));
	return "global";
      case BC_TGETS:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_c(ins))));
	if (ip > proto_bc(pt)) {
	  BCIns insp = ip[-1];
	  if (bc_op(insp) == BC_MOV && bc_a(insp) == ra+1+LJ_FR2 &&
	      bc_d(insp) == bc_b(ins))
	    return "method";
	}
	return "field";
      case BC_UGET:
	*name = lj_debug_uvname(pt, bc_d(ins));
	return "upvalue";
      default:
	return NULL;
      }
    }
  }
  return NULL;
}